

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

Vector * __thiscall
gl4cts::EnhancedLayouts::Utils::VaryingPassthrough::Get(VaryingPassthrough *this,STAGES stage)

{
  TestError *this_00;
  
  switch(stage) {
  case VERTEX:
    this = (VaryingPassthrough *)&this->m_vertex;
    break;
  case TESS_CTRL:
    this = (VaryingPassthrough *)&this->m_tess_ctrl;
    break;
  case TESS_EVAL:
    this = (VaryingPassthrough *)&this->m_tess_eval;
    break;
  case GEOMETRY:
    this = (VaryingPassthrough *)&this->m_geometry;
    break;
  case FRAGMENT:
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0x111b);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  return &this->m_fragment;
}

Assistant:

VaryingConnection::Vector& VaryingPassthrough::Get(Shader::STAGES stage)
{
	VaryingConnection::Vector* result = 0;

	switch (stage)
	{
	case Shader::FRAGMENT:
		result = &m_fragment;
		break;
	case Shader::GEOMETRY:
		result = &m_geometry;
		break;
	case Shader::TESS_CTRL:
		result = &m_tess_ctrl;
		break;
	case Shader::TESS_EVAL:
		result = &m_tess_eval;
		break;
	case Shader::VERTEX:
		result = &m_vertex;
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	return *result;
}